

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdEmuD3D56TlvUv::adjust_orig_mthd(MthdEmuD3D56TlvUv *this)

{
  mt19937 *this_00;
  byte *pbVar1;
  uint32_t *puVar2;
  uint32_t uVar3;
  MthdTest *pMVar4;
  result_type rVar5;
  
  if (this->fin == true) {
    puVar2 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.notify;
    *(byte *)puVar2 = (byte)*puVar2 & 0xfe;
    uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.celsius_pipe_begin_end;
    if ((uVar3 == 10) || (uVar3 == 3)) {
      pbVar1 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                               celsius_pipe_vtx_state + 3);
      *pbVar1 = *pbVar1 & 0x8f;
    }
    if ((this->super_SingleMthdTest).super_MthdTest.cls == 0x48) {
      pMVar4 = &(this->super_SingleMthdTest).super_MthdTest;
      (pMVar4->super_StateTest).exp.valid[0] = 0;
      (pMVar4->super_StateTest).exp.valid[1] = 0;
    }
  }
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar5 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar5 & 1) != 0) {
    puVar2 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *puVar2 = *puVar2 & 0xff800000;
    rVar5 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    puVar2 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *puVar2 = *puVar2 ^ 1 << ((byte)rVar5 & 0x1f);
  }
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin) {
			insrt(orig.notify, 0, 1, 0);
			adjust_orig_icmd(&orig);
		}
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
		}
		if (rnd() & 1) {
			insrt(val, 0, 23, 0);
			val ^= 1 << (rnd() & 0x1f);
		}
	}